

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

PmError Pm_Synchronize(PortMidiStream *stream)

{
  PmError PVar1;
  
  PVar1 = pmBadPtr;
  if (stream != (PortMidiStream *)0x0) {
    if ((descriptors[*stream].pub.output != 0) && (descriptors[*stream].pub.opened != 0)) {
      *(undefined4 *)((long)stream + 0x4c) = 1;
      PVar1 = pmNoData;
    }
  }
  return PVar1;
}

Assistant:

PmError Pm_Synchronize( PortMidiStream* stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.output)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        midi->first_message = TRUE;
    return err;
}